

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_4489d7::OwnershipAnalysis::OwnershipAnalysis
          (OwnershipAnalysis *this,command_set *commands,BuildFileDelegate *fileDelegate)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  Command *pCVar3;
  pointer ppBVar4;
  BuildNode *pBVar5;
  iterator iVar6;
  pointer ppVar7;
  pointer ppVar8;
  long lVar9;
  ulong uVar10;
  StringMapEntryBase **ppSVar11;
  __normal_iterator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_*,_std::vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>_>
  __i;
  pointer ppBVar12;
  pointer ppVar13;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> local_58;
  command_set *local_48;
  vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
  *local_40;
  vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
  *local_38;
  
  p_Var1 = &(this->includedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->excludedPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->excludedPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fileDelegate = fileDelegate;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->directoryInputNodesAndCommands).
  super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar11 = (commands->super_StringMapImpl).TheTable;
  if ((commands->super_StringMapImpl).NumBuckets != 0) {
    for (; (*ppSVar11 == (StringMapEntryBase *)0x0 ||
           (*ppSVar11 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar11 = ppSVar11 + 1) {
    }
  }
  local_48 = commands;
  if (ppSVar11 !=
      (commands->super_StringMapImpl).TheTable + (commands->super_StringMapImpl).NumBuckets) {
    local_38 = (vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                *)&this->outputNodesAndCommands;
    local_40 = (vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
                *)&this->directoryInputNodesAndCommands;
    do {
      pCVar3 = (Command *)(*ppSVar11)[1].StrLen;
      ppBVar4 = *(pointer *)
                 ((long)&(pCVar3->outputs).
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppBVar12 = (pCVar3->outputs).
                      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar12 != ppBVar4;
          ppBVar12 = ppBVar12 + 1) {
        pBVar5 = *ppBVar12;
        if (pBVar5->type != Virtual) {
          iVar6._M_current =
               (this->outputNodesAndCommands).
               super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_58.first = pBVar5;
          if (iVar6._M_current ==
              (this->outputNodesAndCommands).
              super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58.second = pCVar3;
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>
                      (local_38,iVar6,&local_58);
          }
          else {
            (iVar6._M_current)->first = pBVar5;
            (iVar6._M_current)->second = pCVar3;
            pppVar2 = &(this->outputNodesAndCommands).
                       super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
            local_58.second = pCVar3;
          }
        }
      }
      ppBVar4 = *(pointer *)
                 ((long)&(pCVar3->inputs).
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      for (ppBVar12 = (pCVar3->inputs).
                      super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar12 != ppBVar4;
          ppBVar12 = ppBVar12 + 1) {
        pBVar5 = *ppBVar12;
        if (pBVar5->type == Directory) {
          iVar6._M_current =
               (this->directoryInputNodesAndCommands).
               super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_58.first = pBVar5;
          if (iVar6._M_current ==
              (this->directoryInputNodesAndCommands).
              super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_58.second = pCVar3;
            std::
            vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>
            ::
            _M_realloc_insert<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>
                      (local_40,iVar6,&local_58);
          }
          else {
            (iVar6._M_current)->first = pBVar5;
            (iVar6._M_current)->second = pCVar3;
            pppVar2 = &(this->directoryInputNodesAndCommands).
                       super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar2 = *pppVar2 + 1;
            local_58.second = pCVar3;
          }
        }
      }
      do {
        do {
          ppSVar11 = ppSVar11 + 1;
        } while (*ppSVar11 == (StringMapEntryBase *)0x0);
      } while (*ppSVar11 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (ppSVar11 !=
             (local_48->super_StringMapImpl).TheTable + (local_48->super_StringMapImpl).NumBuckets);
  }
  ppVar7 = (this->outputNodesAndCommands).
           super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar8 = (this->outputNodesAndCommands).
           super__Vector_base<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar8) {
    uVar10 = (long)ppVar8 - (long)ppVar7 >> 4;
    lVar9 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
              (ppVar7,ppVar8,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppVar8 - (long)ppVar7 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                (ppVar7,ppVar8);
    }
    else {
      ppVar13 = ppVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                (ppVar7,ppVar13);
      for (; ppVar13 != ppVar8; ppVar13 = ppVar13 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>>
                  (ppVar13);
      }
    }
  }
  return;
}

Assistant:

OwnershipAnalysis(const BuildDescription::command_set& commands, BuildFileDelegate& fileDelegate): fileDelegate(fileDelegate) {
    // Extract outputs and directory inputs of all commands
    for (auto it = commands.begin(); it != commands.end(); it++) {
      Command* command = (*it).getValue().get();
      for (auto output: command->getOutputs()) {
        if (!output->isVirtual()) {
          outputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(output, command));
        }
      }

      for (auto input: command->getInputs()) {
        if (input->isDirectory()) {
          directoryInputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(input, command));
        }
      }
    }

    // Sort paths according to length to ensure we assign owner to parent before assigning owner to its subpaths
    std::sort(outputNodesAndCommands.begin(),
              outputNodesAndCommands.end(),
              [](const std::pair<BuildNode*, Command*> pairA,
                 const std::pair<BuildNode*, Command*> pairB) -> bool {
      return pairA.first->getName().str().length() < pairB.first->getName().str().length();
    });
  }